

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

optional<wasm::Name> * __thiscall
wasm::WATParser::Lexer::takeID(optional<wasm::Name> *__return_storage_ptr__,Lexer *this)

{
  pointer pAVar1;
  undefined1 uVar2;
  undefined1 reuse;
  char *in_RCX;
  IString *this_00;
  string_view sVar3;
  string_view s;
  string_view s_00;
  string_view in;
  undefined1 local_68 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> result;
  
  sVar3 = next(this);
  in._M_len = sVar3._M_str;
  in._M_str = in_RCX;
  anon_unknown_0::ident
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_68,
             (anon_unknown_0 *)sVar3._M_len,in);
  uVar2 = result.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>.
          _M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
          _M_payload._M_value.str.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged;
  reuse = SUB81(in_RCX,0);
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
      ._M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._M_payload.
      _M_value.str.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    this->pos = this->pos + (long)local_68;
    pAVar1 = (this->annotations).
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
      (this->annotations).
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_finish = pAVar1;
    }
    skipSpace(this);
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
        _M_payload._48_1_ == '\x01') {
      s._M_str = (char *)0x0;
      s._M_len = result.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                 ._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
                 _M_payload._16_8_;
      sVar3 = IString::interned((IString *)
                                result.
                                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                                ._M_payload.
                                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                                .
                                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                                ._M_payload._24_8_,s,(bool)reuse);
    }
    else if (result.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
             .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
             _M_payload._8_1_ == '\x01') {
      if ((ulong)local_68 < 2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",2)
        ;
      }
      this_00 = (IString *)((long)local_68 - 2U);
      if ((IString *)((long)local_68 - 3U) <= (IString *)((long)local_68 - 2U)) {
        this_00 = (IString *)((long)local_68 - 3U);
      }
      s_00._M_len = result.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                    ._M_payload.
                    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                    .
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                    ._M_payload._M_value.super_LexResult.span._M_len + 2;
      s_00._M_str = (char *)0x0;
      sVar3 = IString::interned(this_00,s_00,SUB81(this_00,0));
    }
    else {
      if (local_68 == (undefined1  [8])0x0) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1)
        ;
      }
      sVar3._M_len = result.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     ._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                     ._M_payload._M_value.super_LexResult.span._M_len + 1;
      sVar3._M_str = (char *)0x0;
      sVar3 = IString::interned((IString *)((long)local_68 - 1U),sVar3,
                                SUB81((IString *)((long)local_68 - 1U),0));
    }
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str = sVar3;
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_engaged = true;
  }
  if ((result.
       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>.
       _M_payload.
       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
       .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._M_payload
       ._M_value.str.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
      ._M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._M_payload.
      _M_value.str.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>.
     _M_payload.
     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
     .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._M_payload.
     _48_1_ == '\x01')) {
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>.
    _M_payload.
    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
    .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._M_payload.
    _48_1_ = 0;
    if ((undefined1 *)
        result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
        _M_payload._16_8_ !=
        (undefined1 *)
        ((long)&result.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                ._M_payload.
                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
                _M_payload + 0x20)) {
      operator_delete((void *)result.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                              ._M_payload.
                              super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                              .
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                              ._M_payload._16_8_,
                      result.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                      ._M_payload.
                      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                      .
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                      ._M_payload._32_8_ + 1);
    }
  }
  if ((bool)uVar2 == false) {
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Name> Lexer::takeID() {
  if (auto result = ident(next())) {
    pos += result->span.size();
    advance();
    if (result->str) {
      return Name(*result->str);
    }
    if (result->isStr) {
      // Remove '$' and quotes.
      return Name(result->span.substr(2, result->span.size() - 3));
    }
    // Remove '$'.
    return Name(result->span.substr(1));
  }
  return std::nullopt;
}